

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O3

void __thiscall Camera::move_left(Camera *this,float delta_time)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  fVar1 = (this->right).field_2.z;
  fVar2 = this->speed;
  uVar3 = (this->right).field_0;
  uVar5 = (this->right).field_1;
  uVar4 = (this->position).field_0;
  uVar6 = (this->position).field_1;
  (this->position).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
       ((float)uVar4 - fVar2 * delta_time * (float)uVar3);
  (this->position).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       ((float)uVar6 - fVar2 * delta_time * (float)uVar5);
  (this->position).field_2.z = (this->position).field_2.z - fVar1 * delta_time * fVar2;
  return;
}

Assistant:

void Camera::move_left(float delta_time) {
    position -= right * delta_time * speed;
}